

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordCase::iterate(TessCoordCase *this)

{
  pointer *ppvVar1;
  SpacingMode spacingMode;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLint GVar6;
  GLint GVar7;
  GLint GVar8;
  GLint GVar9;
  GLint GVar10;
  GLint GVar11;
  GLenum err;
  TestLog *this_00;
  undefined4 extraout_var;
  char *pcVar12;
  ShaderProgram *this_01;
  Functions *gl_00;
  size_type sVar13;
  const_reference pvVar14;
  const_reference pvVar15;
  reference this_02;
  iterator iVar16;
  iterator iVar17;
  pointer this_03;
  RenderContext *renderCtx_00;
  MessageBuilder *pMVar18;
  TessPrimitiveType TVar19;
  float *outerLevels_00;
  byte local_b6a;
  MessageBuilder local_a98;
  MessageBuilder local_918;
  MessageBuilder local_798;
  MessageBuilder local_618;
  size_type local_498;
  MessageBuilder local_490;
  undefined1 local_310 [8];
  Result tfResult;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *tessCoordsRef;
  MessageBuilder local_2c8;
  float *local_148;
  float *outerLevels;
  float *innerLevels;
  int tessLevelCaseNdx;
  bool success;
  TFHandler tfHandler;
  __normal_iterator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_*,_std::vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>_>
  local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int maxNumVertices;
  int local_a0;
  int i;
  allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_> local_89;
  undefined1 local_88 [8];
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  caseReferences;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  tessLevelCases;
  int tessLevelOuter3Loc;
  int tessLevelOuter2Loc;
  int tessLevelOuter1Loc;
  int tessLevelOuter0Loc;
  int tessLevelInner1Loc;
  int tessLevelInner0Loc;
  Functions *gl;
  undefined1 local_30 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  TessCoordCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar12 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar12);
  outerLevels_00 = (float *)(ulong)dVar5;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_30,(RenderTarget *)CONCAT44(extraout_var,iVar4),0x10,0x10,dVar5
            );
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar5 = glu::ShaderProgram::getProgram(this_01);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  GVar6 = (*gl_00->getUniformLocation)(dVar5,"u_tessLevelInner0");
  GVar7 = (*gl_00->getUniformLocation)(dVar5,"u_tessLevelInner1");
  GVar8 = (*gl_00->getUniformLocation)(dVar5,"u_tessLevelOuter0");
  GVar9 = (*gl_00->getUniformLocation)(dVar5,"u_tessLevelOuter1");
  GVar10 = (*gl_00->getUniformLocation)(dVar5,"u_tessLevelOuter2");
  GVar11 = (*gl_00->getUniformLocation)(dVar5,"u_tessLevelOuter3");
  ppvVar1 = &caseReferences.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  genTessLevelCases((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                     *)ppvVar1,this);
  sVar13 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
           ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                   *)ppvVar1);
  std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>::
  allocator(&local_89);
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            *)local_88,sVar13,&local_89);
  std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>::
  ~allocator(&local_89);
  for (local_a0 = 0; iVar4 = local_a0,
      sVar13 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
               ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                       *)&caseReferences.
                          super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar4 < (int)sVar13;
      local_a0 = local_a0 + 1) {
    TVar19 = this->m_primitiveType;
    spacingMode = this->m_spacing;
    ppvVar1 = &caseReferences.
               super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar14 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                            *)ppvVar1,(long)local_a0);
    pvVar15 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                            *)ppvVar1,(long)local_a0);
    outerLevels_00 = pvVar15->outer;
    generateReferenceTessCoords
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_b8,
               TVar19,spacingMode,pvVar14->inner,outerLevels_00);
    this_02 = std::
              vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
              ::operator[]((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                            *)local_88,(long)local_a0);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator=
              (this_02,(vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       local_b8);
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_b8);
  }
  iVar16 = std::
           vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ::begin((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                    *)local_88);
  iVar17 = std::
           vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ::end((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                  *)local_88);
  local_c8 = std::
             max_element<__gnu_cxx::__normal_iterator<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>*,std::vector<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>,std::allocator<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>>>,deqp::gles31::Functional::(anonymous_namespace)::SizeLessThan<std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>>
                       (iVar16._M_current,iVar17._M_current);
  this_03 = __gnu_cxx::
            __normal_iterator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_*,_std::vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>_>
            ::operator->(&local_c8);
  sVar13 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                     (this_03);
  local_bc = (int)sVar13;
  renderCtx_00 = Context::getRenderContext((this->super_TestCase).m_context);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)&tessLevelCaseNdx,renderCtx_00,
             local_bc);
  innerLevels._7_1_ = 1;
  setViewport(gl_00,(RandomViewport *)local_30);
  (*gl_00->useProgram)(dVar5);
  (*gl_00->patchParameteri)(0x8e72,1);
  innerLevels._0_4_ = 0;
  while( true ) {
    iVar4 = (int)innerLevels;
    TVar19 = (TessPrimitiveType)outerLevels_00;
    sVar13 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
             ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                     *)&caseReferences.
                        super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((int)sVar13 <= iVar4) break;
    ppvVar1 = &caseReferences.
               super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    outerLevels = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                  ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                                *)ppvVar1,(long)(int)innerLevels)->inner;
    pvVar14 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
              ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
                            *)ppvVar1,(long)(int)innerLevels);
    local_148 = pvVar14->outer;
    tcu::TestLog::operator<<(&local_2c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar18 = tcu::MessageBuilder::operator<<(&local_2c8,(char (*) [22])"Tessellation levels: ");
    (anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              ((string *)&tessCoordsRef,(_anonymous_namespace_ *)outerLevels,local_148,
               (float *)(ulong)this->m_primitiveType,TVar19);
    pMVar18 = tcu::MessageBuilder::operator<<
                        (pMVar18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&tessCoordsRef);
    tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&tessCoordsRef);
    tcu::MessageBuilder::~MessageBuilder(&local_2c8);
    (*gl_00->uniform1f)(GVar6,*outerLevels);
    (*gl_00->uniform1f)(GVar7,outerLevels[1]);
    (*gl_00->uniform1f)(GVar8,*local_148);
    (*gl_00->uniform1f)(GVar9,local_148[1]);
    (*gl_00->uniform1f)(GVar10,local_148[2]);
    (*gl_00->uniform1f)(GVar11,local_148[3]);
    err = (*gl_00->getError)();
    glu::checkError(err,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x81e);
    tfResult.varying.
    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                  ::operator[]((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                                *)local_88,(long)(int)innerLevels);
    outerLevels_00 = (float *)0x0;
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
              ((Result *)local_310,
               (TransformFeedbackHandler<tcu::Vector<float,_3>_> *)&tessLevelCaseNdx,dVar5,0,0,
               (VertexArrayBinding *)0x0,1);
    uVar2 = local_310._0_4_;
    sVar13 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        tfResult.varying.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar2 == (int)sVar13) {
      tcu::TestLog::operator<<(&local_618,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<
                          (&local_618,
                           (char (*) [66])
                           "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ");
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(int *)local_310);
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_618);
    }
    else {
      tcu::TestLog::operator<<(&local_490,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<
                          (&local_490,
                           (char (*) [69])
                           "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ");
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(int *)local_310);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [22])", reference value is ");
      local_498 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)tfResult.varying.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_498);
      pMVar18 = tcu::MessageBuilder::operator<<
                          (pMVar18,(char (*) [31])" (logging further info anyway)");
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_490);
      innerLevels._7_1_ = 0;
    }
    if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      tcu::TestLog::operator<<(&local_798,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<
                          (&local_798,
                           (char (*) [121])
                           "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                          );
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_798);
    }
    else if ((this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) ||
            (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)) {
      tcu::TestLog::operator<<(&local_918,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<
                          (&local_918,
                           (char (*) [109])
                           "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                          );
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_918);
    }
    bVar3 = compareTessCoords(this_00,this->m_primitiveType,
                              (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)tfResult.varying.
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)&tfResult);
    local_b6a = 0;
    if (bVar3) {
      local_b6a = innerLevels._7_1_;
    }
    innerLevels._7_1_ = local_b6a & 1;
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::Result::~Result((Result *)local_310);
    if ((innerLevels._7_1_ & 1) == 0) break;
    tcu::TestLog::operator<<(&local_a98,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar18 = tcu::MessageBuilder::operator<<(&local_a98,(char (*) [7])"All OK");
    tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a98);
    innerLevels._0_4_ = (int)innerLevels + 1;
  }
  pcVar12 = "Invalid tessellation coordinates";
  if ((innerLevels._7_1_ & 1) != 0) {
    pcVar12 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~innerLevels._7_1_ & QP_TEST_RESULT_FAIL,pcVar12);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<tcu::Vector<float,_3>_> *)&tessLevelCaseNdx);
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::~vector((vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             *)local_88);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TessCoordCase::TessLevels>_>
             *)&caseReferences.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

TessCoordCase::IterateResult TessCoordCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelInner0Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner0");
	const int						tessLevelInner1Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner1");
	const int						tessLevelOuter0Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter0");
	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");
	const int						tessLevelOuter2Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter2");
	const int						tessLevelOuter3Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter3");

	const vector<TessLevels>		tessLevelCases				= genTessLevelCases();
	vector<vector<Vec3> >			caseReferences				(tessLevelCases.size());

	for (int i = 0; i < (int)tessLevelCases.size(); i++)
		caseReferences[i] = generateReferenceTessCoords(m_primitiveType, m_spacing, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const int						maxNumVertices				= (int)std::max_element(caseReferences.begin(), caseReferences.end(), SizeLessThan<vector<Vec3> >())->size();
	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float* const innerLevels = &tessLevelCases[tessLevelCaseNdx].inner[0];
		const float* const outerLevels = &tessLevelCases[tessLevelCaseNdx].outer[0];

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels, m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(tessLevelInner0Loc, innerLevels[0]);
		gl.uniform1f(tessLevelInner1Loc, innerLevels[1]);
		gl.uniform1f(tessLevelOuter0Loc, outerLevels[0]);
		gl.uniform1f(tessLevelOuter1Loc, outerLevels[1]);
		gl.uniform1f(tessLevelOuter2Loc, outerLevels[2]);
		gl.uniform1f(tessLevelOuter3Loc, outerLevels[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const vector<Vec3>&			tessCoordsRef	= caseReferences[tessLevelCaseNdx];
			const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);

			if (tfResult.numPrimitives != (int)tessCoordsRef.size())
			{
				log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
										<< tfResult.numPrimitives << ", reference value is " << tessCoordsRef.size()
										<< " (logging further info anyway)" << TestLog::EndMessage;
				success = false;
			}
			else
				log << TestLog::Message << "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be " << tfResult.numPrimitives << TestLog::EndMessage;

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << TestLog::EndMessage;
			else
				DE_ASSERT(false);

			success = compareTessCoords(log, m_primitiveType, tessCoordsRef, tfResult.varying) && success;
		}

		if (!success)
			break;
		else
			log << TestLog::Message << "All OK" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}